

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeString(AsciiParser *this,StringData *str)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  StreamReader *pSVar8;
  char *pcVar9;
  char nc;
  stringstream ss;
  string local_208;
  Cursor local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (str != (StringData *)0x0) {
    pSVar8 = this->_sr;
    uVar5 = pSVar8->length_;
    uVar3 = pSVar8->idx_;
    uVar7 = uVar3 + 1;
    if (uVar7 <= uVar5) {
      puVar6 = &pSVar8->idx_;
      local_1e8 = this->_curr_cursor;
      uStack_1e0 = 0;
      uVar1 = pSVar8->binary_[uVar3];
      pSVar8->idx_ = uVar7;
      if ((uVar1 == '\"') || (uVar1 == '\'')) {
        if (uVar7 < uVar5) {
          do {
            uVar2 = pSVar8->binary_[uVar7];
            if (uVar2 == '\0') break;
            *puVar6 = uVar7 + 1;
            if (uVar2 == '\\') {
              bVar4 = LookChar1(this,(char *)&local_208);
              if (!bVar4) goto LAB_0035ba71;
              if ((uint8_t)local_208._M_dataplus._M_p == '\"') {
                pcVar9 = "\"";
              }
              else {
                if ((uint8_t)local_208._M_dataplus._M_p != '\'') goto LAB_0035b9fc;
                pcVar9 = "\'";
              }
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar9,1);
              pSVar8 = this->_sr;
              if ((-2 < (long)pSVar8->idx_) && (uVar7 = pSVar8->idx_ + 1, uVar7 <= pSVar8->length_))
              {
                pSVar8->idx_ = uVar7;
              }
            }
            else {
              if ((uVar2 == '\r') || (uVar2 == '\n')) goto LAB_0035ba69;
              if (uVar1 == '\'') {
                if (uVar2 == '\'') {
LAB_0035baa5:
                  ::std::__cxx11::stringbuf::str();
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                  (uint8_t)local_208._M_dataplus._M_p) != &local_208.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                             (uint8_t)local_208._M_dataplus._M_p),
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  unescapeControlSequence(&local_208,&local_1d8);
                  ::std::__cxx11::string::operator=((string *)str,(string *)&local_208);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                  (uint8_t)local_208._M_dataplus._M_p) != &local_208.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                             (uint8_t)local_208._M_dataplus._M_p),
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  str->line_row = local_1e8.row;
                  str->line_col = local_1e8.col;
                  str->is_triple_quoted = false;
                  (this->_curr_cursor).col =
                       (this->_curr_cursor).col + (int)local_208._M_string_length + 2;
                  bVar4 = true;
                  goto LAB_0035ba73;
                }
              }
              else if (uVar2 == '\"') goto LAB_0035baa5;
LAB_0035b9fc:
              local_208._M_dataplus._M_p._0_1_ = uVar2;
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_208,1);
            }
            pSVar8 = this->_sr;
            puVar6 = &pSVar8->idx_;
            uVar5 = pSVar8->length_;
            uVar7 = pSVar8->idx_;
          } while (uVar7 < uVar5);
        }
        if (uVar3 <= uVar5) {
          pSVar8->idx_ = uVar3;
        }
      }
      else {
LAB_0035ba69:
        if (uVar3 <= uVar5) {
          *puVar6 = uVar3;
        }
      }
    }
  }
LAB_0035ba71:
  bVar4 = false;
LAB_0035ba73:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar4;
}

Assistant:

bool AsciiParser::MaybeString(value::StringData *str) {
  std::stringstream ss;

  if (!str) {
    return false;
  }

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  char c0;
  if (!Char1(&c0)) {
    SeekTo(loc);
    return false;
  }

  // ' or " allowed.
  if ((c0 != '"') && (c0 != '\'')) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = (c0 == '\'');

  bool end_with_quotation{false};

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      SeekTo(loc);
      return false;
    }

    if ((c == '\n') || (c == '\r')) {
      SeekTo(loc);
      return false;
    }

    if (c == '\\') {
      // escaped quote? \" \'
      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == '\'') {
        ss << "'";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      } else if (nc == '"') {
        ss << "\"";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      }
    }

    if (single_quote) {
      if (c == '\'') {
        end_with_quotation = true;
        break;
      }
    } else {
      if (c == '"') {
        end_with_quotation = true;
        break;
      }
    }

    ss << c;
  }

  if (!end_with_quotation) {
    SeekTo(loc);
    return false;
  }

  DCOUT("Single quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  size_t displayed_string_len = ss.str().size();
  str->value = unescapeControlSequence(ss.str());
  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = false;

  _curr_cursor.col += int(displayed_string_len + 2);  // +2 for quotation chars

  return true;
}